

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<double>_>::Decompose_LDLt(TPZMatrix<std::complex<double>_> *this)

{
  complex<double> a;
  int iVar1;
  bool bVar2;
  int64_t iVar3;
  int64_t iVar4;
  long lVar5;
  TPZBaseMatrix *in_RDI;
  undefined8 uVar6;
  char *in_stack_00000048;
  char *in_stack_00000050;
  complex<double> val;
  int k_1;
  complex<double> sum_1;
  int l;
  complex<double> tmp;
  int k;
  complex<double> sum;
  int j;
  int dim;
  complex<double> *in_stack_fffffffffffffe48;
  complex<double> *in_stack_fffffffffffffe50;
  undefined1 local_160 [8];
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  int local_ec;
  complex<double> local_e8;
  int local_d4;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined1 local_a0 [8];
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  int local_2c;
  complex<double> local_28;
  int local_18;
  int local_14;
  
  if ((in_RDI->fDecomposed == '\0') || (in_RDI->fDecomposed == '\x04')) {
    if (in_RDI->fDecomposed != '\0') {
      return 4;
    }
  }
  else {
    Error(in_stack_00000050,in_stack_00000048);
  }
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  iVar4 = TPZBaseMatrix::Cols(in_RDI);
  if (iVar3 != iVar4) {
    Error(in_stack_00000050,in_stack_00000048);
  }
  iVar4 = TPZBaseMatrix::Rows(in_RDI);
  local_14 = (int)iVar4;
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    uVar6 = 0;
    std::complex<double>::complex(&local_28,0.0,0.0);
    for (local_2c = 0; local_2c < local_18; local_2c = local_2c + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_2c,(long)local_2c);
      local_58 = uVar6;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_2c,(long)local_18);
      local_78 = uVar6;
      std::conj<double>(in_stack_fffffffffffffe50);
      local_68 = uVar6;
      std::operator*(in_stack_fffffffffffffe48,(complex<double> *)0x12b8c4b);
      local_48 = uVar6;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_2c,(long)local_18);
      local_88 = uVar6;
      std::operator*(in_stack_fffffffffffffe48,(complex<double> *)0x12b8ca2);
      local_38 = uVar6;
      std::complex<double>::operator+=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    }
    in_stack_fffffffffffffe50 = (complex<double> *)(long)local_18;
    lVar5 = (long)local_18;
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_18,(long)local_18);
    local_a8 = uVar6;
    std::operator-(in_stack_fffffffffffffe48,(complex<double> *)0x12b8d3e);
    local_98 = uVar6;
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
              (in_RDI,in_stack_fffffffffffffe50,lVar5,local_a0);
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_18,(long)local_18);
    a._M_value._8_8_ = iVar3;
    a._M_value._0_8_ = lVar5;
    local_c8 = uVar6;
    local_b8 = uVar6;
    bVar2 = IsZero(a);
    iVar1 = local_18;
    if (bVar2) {
      Error(in_stack_00000050,in_stack_00000048);
      iVar1 = local_18;
    }
    while (local_d4 = iVar1 + 1, local_d4 < local_14) {
      uVar6 = 0;
      std::complex<double>::complex(&local_e8,0.0,0.0);
      for (local_ec = 0; local_ec < local_18; local_ec = local_ec + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_ec,(long)local_ec);
        local_118 = uVar6;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_18,(long)local_ec);
        local_138 = uVar6;
        std::conj<double>(in_stack_fffffffffffffe50);
        local_128 = uVar6;
        std::operator*(in_stack_fffffffffffffe48,(complex<double> *)0x12b8ed2);
        local_108 = uVar6;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_d4,(long)local_ec);
        local_148 = uVar6;
        std::operator*(in_stack_fffffffffffffe48,(complex<double> *)0x12b8f20);
        local_f8 = uVar6;
        std::complex<double>::operator+=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_d4,(long)local_18);
      std::operator-(in_stack_fffffffffffffe48,(complex<double> *)0x12b8f99);
      std::operator/(in_stack_fffffffffffffe48,(complex<double> *)0x12b8fb7);
      local_158 = uVar6;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                (in_RDI,(long)local_d4,(long)local_18,local_160);
      std::conj<double>(in_stack_fffffffffffffe50);
      local_158 = uVar6;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                (in_RDI,(long)local_18,(long)local_d4,local_160);
      iVar1 = local_d4;
    }
  }
  in_RDI->fDecomposed = '\x04';
  in_RDI->fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}